

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_minVecScalar_vec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  fVar5 = c->in[1].m_data[0];
  uVar6 = -(uint)(fVar2 <= fVar5);
  uVar7 = -(uint)(fVar3 <= fVar5);
  uVar8 = -(uint)(fVar4 <= fVar5);
  uVar9 = -(uint)(fVar1 <= fVar5);
  (c->color).m_data[0] = (float)(~uVar6 & (uint)fVar5 | (uint)fVar2 & uVar6);
  (c->color).m_data[1] = (float)(~uVar7 & (uint)fVar5 | (uint)fVar3 & uVar7);
  (c->color).m_data[2] = (float)(~uVar8 & (uint)fVar5 | (uint)fVar4 & uVar8);
  (c->color).m_data[3] = (float)(~uVar9 & (uint)fVar5 | (uint)fVar1 & uVar9);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }